

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

void nsync::nsync_mu_rlock(nsync_mu *mu)

{
  int iVar1;
  uint o;
  waiter *w_00;
  waiter *w;
  uint32_t old_word;
  nsync_mu *mu_local;
  
  iVar1 = atm_cas_acq_u32_(&mu->word,0,0x100);
  if ((iVar1 == 0) &&
     ((o = std::atomic_load_explicit<unsigned_int>(&mu->word,memory_order_relaxed), (o & 0x61) != 0
      || (iVar1 = atm_cas_acq_u32_(&mu->word,o,o + 0x100), iVar1 == 0)))) {
    w_00 = nsync_waiter_new_();
    nsync_mu_lock_slow_(mu,w_00,0,(lock_type *)nsync_reader_type_);
    nsync_waiter_free_(w_00);
  }
  return;
}

Assistant:

void nsync_mu_rlock (nsync_mu *mu) {
	IGNORE_RACES_START ();
	if (!ATM_CAS_ACQ (&mu->word, 0, MU_RADD_TO_ACQUIRE)) { /* acquire CAS */
		uint32_t old_word = ATM_LOAD (&mu->word);
		if ((old_word&MU_RZERO_TO_ACQUIRE) != 0 ||
		    !ATM_CAS_ACQ (&mu->word, old_word,
				  (old_word+MU_RADD_TO_ACQUIRE) & ~MU_RCLEAR_ON_ACQUIRE)) {
			waiter *w = nsync_waiter_new_ ();
			nsync_mu_lock_slow_ (mu, w, 0, nsync_reader_type_);
			nsync_waiter_free_ (w);
		}
	}
	IGNORE_RACES_END ();
	RWLOCK_TRYACQUIRE (1, mu, 0);
}